

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TagTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::Tag_testThriftConversion_Test::Tag_testThriftConversion_Test
          (Tag_testThriftConversion_Test *this)

{
  Tag_testThriftConversion_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Tag_testThriftConversion_Test_003af188;
  return;
}

Assistant:

TEST(Tag, testThriftConversion)
{
    const Tag tags[] = { { "testBool", true },
                         { "testDouble", 0.0 },
                         { "testInt64", 0LL },
                         { "testUint64", 0ULL },
                         { "testStr", std::string{ "test" } },
                         { "testNull", nullptr },
                         { "testCStr", "test" } };

    for (auto&& tag : tags) {
        thrift::Tag thriftTag;
        ASSERT_NO_THROW(tag.thrift(thriftTag));
    }
}